

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

string * tinyusdz::buildEscapedAndQuotedStringForUSDA(string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  long *plVar2;
  char *pcVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  string delim;
  long *local_b0;
  char *local_a8;
  long local_a0 [2];
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  uVar1 = str->_M_string_length;
  if (uVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\"","");
  }
  else {
    pcVar3 = (str->_M_dataplus)._M_p;
    bVar7 = true;
    uVar6 = 1;
    do {
      if ((pcVar3[uVar6 - 1] == '\n') || (pcVar3[uVar6 - 1] == '\r')) break;
      bVar7 = uVar6 < uVar1;
      bVar8 = uVar6 != uVar1;
      uVar6 = uVar6 + 1;
    } while (bVar8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (bVar7) {
      bVar7 = hasTripleQuotes(str,false);
      bVar8 = hasTripleQuotes(str,true);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\"\"\"","");
      if (bVar7 && bVar8) {
LAB_0014a22e:
        bVar7 = true;
      }
      else {
        if (!bVar7) {
          if (!bVar8) goto LAB_0014a1a5;
          pcVar3 = "\'\'\'";
LAB_0014a3bc:
          std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,(ulong)pcVar3);
          goto LAB_0014a1a5;
        }
LAB_0014a249:
        bVar7 = false;
      }
      escapeSingleQuote(&local_90,str,bVar7);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014a280;
    }
    bVar7 = true;
    if (*pcVar3 == '\'') {
LAB_0014a1e5:
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        if (uVar1 == uVar5) break;
        uVar6 = uVar5 + 1;
      } while (pcVar3[uVar5] != '\"');
      bVar8 = uVar5 < uVar1;
    }
    else {
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        if (uVar1 == uVar5) break;
        uVar6 = uVar5 + 1;
      } while (pcVar3[uVar5] != '\'');
      bVar7 = uVar5 < uVar1;
      bVar8 = true;
      if (*pcVar3 != '\"') goto LAB_0014a1e5;
    }
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\"","");
    if ((bool)(bVar7 & bVar8)) goto LAB_0014a22e;
    if (bVar7) goto LAB_0014a249;
    if (bVar8) {
      pcVar3 = "\'";
      goto LAB_0014a3bc;
    }
  }
LAB_0014a1a5:
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_0014a280:
  escapeControlSequence(&local_50,__return_storage_ptr__);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b0,local_a8 + (long)local_b0);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string buildEscapedAndQuotedStringForUSDA(const std::string &str) {
  // Rule for triple quote string:
  //
  // if str contains newline
  //   if str contains """ and '''
  //      use quote """ and escape " to \\", no escape for '''
  //   elif str contains """ only
  //      use quote ''' and no escape for """
  //   elif str contains ''' only
  //      use quote """ and no escape for '''
  //   else
  //      use quote """
  //
  // Rule for single quote string
  //   if str contains " and '
  //      use quote " and escape " to \\", no escape for '
  //   elif str contains " only
  //      use quote ' and no escape for "
  //   elif str contains ' only
  //      use quote " and no escape for '
  //   else
  //      use quote "

  bool has_newline = hasNewline(str);

  std::string s;

  if (has_newline) {
    bool has_triple_single_quoted_string = hasTripleQuotes(str, false);
    bool has_triple_double_quoted_string = hasTripleQuotes(str, true);

    std::string delim = "\"\"\"";
    if (has_triple_single_quoted_string && has_triple_double_quoted_string) {
      s = escapeSingleQuote(str, true);
    } else if (has_triple_single_quoted_string) {
      s = escapeSingleQuote(str, false);
    } else if (has_triple_double_quoted_string) {
      delim = "'''";
      s = str;
    } else {
      s = str;
    }

    s = quote(escapeControlSequence(s), delim);

  } else {
    // single quote string.
    bool has_single_quote = hasQuotes(str, false);
    bool has_double_quote = hasQuotes(str, true);

    std::string delim = "\"";
    if (has_single_quote && has_double_quote) {
      s = escapeSingleQuote(str, true);
    } else if (has_single_quote) {
      s = escapeSingleQuote(str, false);
    } else if (has_double_quote) {
      delim = "'";
      s = str;
    } else {
      s = str;
    }

    s = quote(escapeControlSequence(s), delim);
  }

  return s;
}